

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O1

void delete_ast_function_expression(AST_Function_Expression *function_expression)

{
  AST *ast;
  
  if (function_expression->id != (AST *)0x0) {
    delete_ast(function_expression->id);
  }
  if ((function_expression->arguments).size != 0) {
    do {
      ast = (AST *)Queue_Pop(&function_expression->arguments);
      delete_ast(ast);
    } while ((function_expression->arguments).size != 0);
  }
  free(function_expression);
  return;
}

Assistant:

void delete_ast_function_expression(struct AST_Function_Expression *function_expression)
{
	struct Queue_Node *it;
	if(function_expression->id!=NULL)
		delete_ast(function_expression->id);
	while(function_expression->arguments.size>0)
		delete_ast(Queue_Pop(&function_expression->arguments));

	free(function_expression);
	
}